

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionTask::GammaCorrection
          (FunctionTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,
          uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma
          )

{
  undefined8 uVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined4 in_stack_00000010;
  uint32_t in_stack_00000024;
  Image *in_stack_00000028;
  uint32_t in_stack_00000030;
  uint32_t in_stack_00000034;
  Image *in_stack_00000038;
  uint32_t in_stack_00000050;
  TaskName in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  
  FunctionPoolTask::_setup
            ((FunctionPoolTask *)gamma,in_stack_00000038,in_stack_00000034,in_stack_00000030,
             in_stack_00000028,in_stack_00000024,in_stack_00000050,(uint32_t)out,startYIn);
  if ((0.0 <= in_XMM0_Qa) && (0.0 <= in_XMM1_Qa)) {
    *(double *)(in_RDI + 0xb0) = in_XMM0_Qa;
    *(double *)(in_RDI + 0xb8) = in_XMM1_Qa;
    _process((FunctionTask *)CONCAT44(in_stack_ffffffffffffff94,in_stack_00000010),
             in_stack_ffffffffffffff8c);
    return;
  }
  uVar1 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                              uint32_t width, uint32_t height, double a, double gamma )
        {
            _setup( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

            if( a < 0 || gamma < 0 )
                throw imageException( "Bad input parameters in image function" );

            _dataIn.coefficientA     = a;
            _dataIn.coefficientGamma = gamma;

            _process( _GammaCorrection );
        }